

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O1

bool __thiscall trimesh::dataset_t::compare_cells<2>(dataset_t *this,cellid_t *c1,cellid_t *c2)

{
  tri_cc_t *ptVar1;
  bool bVar2;
  bool bVar3;
  cellid_t *pcVar4;
  cellid_t f2;
  cellid_t f1;
  cellid_t local_28;
  int local_24;
  
  pcVar4 = max_fct(this,*c1);
  local_24 = *pcVar4;
  pcVar4 = max_fct(this,*c2);
  local_28 = *pcVar4;
  if (local_24 != local_28) {
    bVar2 = compare_cells<1>(this,&local_24,&local_28);
    return bVar2;
  }
  ptVar1 = (this->m_tcc).px;
  if (ptVar1 != (tri_cc_t *)0x0) {
    local_24 = tri_cc_t::get_opp_cell(ptVar1,local_24,*c1);
    ptVar1 = (this->m_tcc).px;
    if (ptVar1 != (tri_cc_t *)0x0) {
      local_28 = tri_cc_t::get_opp_cell(ptVar1,local_28,*c2);
      ptVar1 = (this->m_tcc).px;
      if (ptVar1 != (tri_cc_t *)0x0) {
        bVar2 = tri_cc_t::is_cell_boundry(ptVar1,local_24);
        ptVar1 = (this->m_tcc).px;
        if (ptVar1 != (tri_cc_t *)0x0) {
          bVar3 = tri_cc_t::is_cell_boundry(ptVar1,local_28);
          if (bVar2 != bVar3) {
            return bVar2;
          }
          bVar2 = compare_cells<0>(this,&local_24,&local_28);
          return bVar2;
        }
      }
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
               );
}

Assistant:

inline bool dataset_t::compare_cells(const cellid_t & c1, const cellid_t &c2) const
  {
    cellid_t f1 = max_fct(c1);
    cellid_t f2 = max_fct(c2);

    if(f1 != f2)
      return compare_cells<dim-1>(f1,f2);

    f1 = m_tcc->get_opp_cell(f1,c1);
    f2 = m_tcc->get_opp_cell(f2,c2);

    bool is_bnd_f1 = m_tcc->is_cell_boundry(f1);
    bool is_bnd_f2 = m_tcc->is_cell_boundry(f2);

    if(is_bnd_f1 != is_bnd_f2)
      return (is_bnd_f1);

    return compare_cells<0>(f1,f2);
  }